

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender __thiscall
fmt::v10::detail::write_nonfinite<char,fmt::v10::appender>
          (detail *this,appender out,bool isnan,format_specs<char> specs,float_specs *fspecs)

{
  uint uVar1;
  appender aVar2;
  undefined7 in_register_00000011;
  char *pcVar3;
  bool bVar4;
  format_specs<char> specs_local;
  anon_class_16_2_632e021f local_10;
  
  specs_local._1_7_ = in_register_00000011;
  specs_local.width._0_1_ = isnan;
  specs_local._8_8_ = specs._0_8_;
  uVar1 = *(uint *)(specs._8_8_ + 4);
  if ((specs_local._8_8_ & 0xff000000ff000000) == 0x100000030000000) {
    specs_local.fill._1_4_ = specs.precision;
    specs_local._8_3_ = specs.width._0_3_;
    specs_local.fill.data_[0] = ' ';
  }
  bVar4 = (uVar1 >> 0x10 & 1) == 0;
  pcVar3 = "NAN";
  if (bVar4) {
    pcVar3 = "nan";
  }
  local_10.str = "INF";
  if (bVar4) {
    local_10.str = "inf";
  }
  if ((char)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container != '\0') {
    local_10.str = pcVar3;
  }
  local_10.sign = (sign_t)(uVar1 >> 8);
  aVar2 = write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_nonfinite<char,fmt::v10::appender>(fmt::v10::appender,bool,fmt::v10::format_specs<char>,fmt::v10::detail::float_specs_const&)::_lambda(fmt::v10::appender)_1_>
                    ((appender)this,&specs_local,4 - (ulong)(local_10.sign == none),&local_10);
  return (appender)aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_nonfinite(OutputIt out, bool isnan,
                                     format_specs<Char> specs,
                                     const float_specs& fspecs) -> OutputIt {
  auto str =
      isnan ? (fspecs.upper ? "NAN" : "nan") : (fspecs.upper ? "INF" : "inf");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  // Replace '0'-padding with space for non-finite values.
  const bool is_zero_fill =
      specs.fill.size() == 1 && *specs.fill.data() == static_cast<Char>('0');
  if (is_zero_fill) specs.fill[0] = static_cast<Char>(' ');
  return write_padded(out, specs, size, [=](reserve_iterator<OutputIt> it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    return copy_str<Char>(str, str + str_size, it);
  });
}